

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O0

void __thiscall
QSslSocket::setLocalCertificate(QSslSocket *this,QString *path,EncodingFormat format)

{
  QFlagsStorage<QIODeviceBase::OpenModeFlag> QVar1;
  ulong uVar2;
  enum_type in_EDX;
  QSslSocket *in_RSI;
  long in_FS_OFFSET;
  QFile file;
  enum_type in_stack_ffffffffffffffb0;
  EncodingFormat in_stack_ffffffffffffffd4;
  QByteArray *in_stack_ffffffffffffffd8;
  QSslCertificate *in_stack_ffffffffffffffe0;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = 0xaaaaaaaaaaaaaaaa;
  local_10 = 0xaaaaaaaaaaaaaaaa;
  QFile::QFile((QFile *)&local_18,(QString *)in_RSI);
  QVar1.i = (Int)::operator|(in_EDX,in_stack_ffffffffffffffb0);
  uVar2 = QFile::open((QFlags_conflict *)&local_18);
  if ((uVar2 & 1) != 0) {
    QIODevice::readAll();
    QSslCertificate::QSslCertificate
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4);
    setLocalCertificate(in_RSI,(QSslCertificate *)CONCAT44(in_EDX,QVar1.i));
    QSslCertificate::~QSslCertificate((QSslCertificate *)0x3a24a5);
    QByteArray::~QByteArray((QByteArray *)0x3a24af);
  }
  QFile::~QFile((QFile *)&local_18);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QSslSocket::setLocalCertificate(const QString &path,
                                     QSsl::EncodingFormat format)
{
    QFile file(path);
    if (file.open(QIODevice::ReadOnly | QIODevice::Text))
        setLocalCertificate(QSslCertificate(file.readAll(), format));

}